

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::ResetRenderTargets
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this)

{
  ulong uVar1;
  RefCntAutoPtr<Diligent::TextureViewGLImpl> *this_00;
  Uint32 rt;
  ulong uVar2;
  string msg;
  string local_50;
  
  this_00 = this->m_pBoundRenderTargets;
  for (uVar2 = 0; uVar1 = (ulong)this->m_NumBoundRenderTargets, uVar2 < uVar1; uVar2 = uVar2 + 1) {
    RefCntAutoPtr<Diligent::TextureViewGLImpl>::Release(this_00);
    this_00 = this_00 + 1;
  }
  for (; uVar1 < 8; uVar1 = uVar1 + 1) {
    if (this->m_pBoundRenderTargets[uVar1].m_pObject != (TextureViewGLImpl *)0x0) {
      FormatString<char[29]>(&local_50,(char (*) [29])"Non-null render target found");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"ResetRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5a2);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  this->m_DvpRenderTargetFormatsHash = 0;
  this->m_NumBoundRenderTargets = 0;
  this->m_FramebufferWidth = 0;
  this->m_FramebufferHeight = 0;
  this->m_FramebufferSlices = 0;
  this->m_FramebufferSamples = 0;
  RefCntAutoPtr<Diligent::TextureViewGLImpl>::Release(&this->m_pBoundDepthStencil);
  RefCntAutoPtr<Diligent::ITextureView>::Release(&this->m_pBoundShadingRateMap);
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::ResetRenderTargets()
{
    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
        m_pBoundRenderTargets[rt].Release();
#ifdef DILIGENT_DEBUG
    for (Uint32 rt = m_NumBoundRenderTargets; rt < _countof(m_pBoundRenderTargets); ++rt)
    {
        VERIFY(m_pBoundRenderTargets[rt] == nullptr, "Non-null render target found");
    }
#endif
    m_NumBoundRenderTargets = 0;
    m_FramebufferWidth      = 0;
    m_FramebufferHeight     = 0;
    m_FramebufferSlices     = 0;
    m_FramebufferSamples    = 0;
#ifdef DILIGENT_DEVELOPMENT
    m_DvpRenderTargetFormatsHash = 0;
#endif

    m_pBoundDepthStencil.Release();
    m_pBoundShadingRateMap.Release();

    // Do not reset framebuffer here as there may potentially
    // be a subpass without any render target attachments.
}